

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ZipDatabase::write_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  bool bVar1;
  mz_bool mVar2;
  LogLevel LVar3;
  Entry local_a0;
  mz_uint local_8c;
  char local_88 [4];
  uint mz_flags;
  char str [41];
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false> local_50
  ;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false> local_48
  ;
  iterator itr;
  PayloadWriteFlags flags_local;
  size_t size_local;
  void *blob_local;
  Hash hash_local;
  ZipDatabase *pZStack_18;
  ResourceTag tag_local;
  ZipDatabase *this_local;
  
  if ((flags & 1) == 0) {
    if (((this->alive & 1U) == 0) || (this->mode == ReadOnly)) {
      this_local._7_1_ = false;
    }
    else {
      itr.
      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
      ._M_cur._4_4_ = flags;
      blob_local = (void *)hash;
      hash_local._4_4_ = tag;
      pZStack_18 = this;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
           ::find(this->seen_blobs + tag,(key_type *)&blob_local);
      local_50._M_cur =
           (__node_type *)
           std::
           end<std::unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>>
                     (this->seen_blobs + hash_local._4_4_);
      bVar1 = std::__detail::operator!=(&local_48,&local_50);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        sprintf(local_88,"%0*x",0x18,(ulong)hash_local._4_4_);
        sprintf(str + 0x10,"%016lx",blob_local);
        if ((itr.
             super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
             ._M_cur._4_4_ & 2) == 0) {
          local_8c = 0;
        }
        else if ((itr.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
                  ._M_cur._4_4_ & 4) == 0) {
          local_8c = 1;
        }
        else {
          local_8c = 9;
        }
        mVar2 = mz_zip_writer_add_mem(&this->mz,local_88,blob,size,local_8c);
        if (mVar2 == 0) {
          LVar3 = get_thread_log_level();
          if (((int)LVar3 < 3) &&
             (bVar1 = Internal::log_thread_callback(LOG_ERROR,"Failed to add blob to cache.\n"),
             !bVar1)) {
            fprintf(_stderr,"Fossilize ERROR: Failed to add blob to cache.\n");
          }
          this_local._7_1_ = false;
        }
        else {
          bVar1 = DatabaseInterface::test_resource_filter
                            (&this->super_DatabaseInterface,hash_local._4_4_,(Hash)blob_local);
          if (bVar1) {
            local_a0.index = 0xffffffff;
            local_a0.size = size;
            std::
            unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>
            ::emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                      ((unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>
                        *)(this->seen_blobs + hash_local._4_4_),(unsigned_long *)&blob_local,
                       &local_a0);
          }
          this_local._7_1_ = true;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		unsigned mz_flags;
		if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			if ((flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0)
				mz_flags = MZ_BEST_COMPRESSION;
			else
				mz_flags = MZ_BEST_SPEED;
		}
		else
			mz_flags = MZ_NO_COMPRESSION;

		if (!mz_zip_writer_add_mem(&mz, str, blob, size, mz_flags))
		{
			LOGE_LEVEL("Failed to add blob to cache.\n");
			return false;
		}

		// The index is irrelevant, we're not going to read from this archive any time soon.
		if (test_resource_filter(static_cast<ResourceTag>(tag), hash))
			seen_blobs[tag].emplace(hash, Entry{~0u, size});
		return true;
	}